

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInputSetup.cpp
# Opt level: O0

void __thiscall
uInputPlus::uInputDeviceInfo::uInputDeviceInfo
          (uInputDeviceInfo *this,string *name,uint16_t bus_type,uint16_t vid,uint16_t pid,
          uint16_t version)

{
  uint16_t version_local;
  uint16_t pid_local;
  uint16_t vid_local;
  uint16_t bus_type_local;
  string *name_local;
  uInputDeviceInfo *this_local;
  
  (this->usetup).id.bustype = 0;
  (this->usetup).id.vendor = 0;
  (this->usetup).id.product = 0;
  (this->usetup).id.version = 0;
  memset((this->usetup).name,0,0x50);
  (this->usetup).ff_effects_max = 0;
  this->BusType = (uint16_t *)this;
  this->Vendor = &(this->usetup).id.vendor;
  this->Product = &(this->usetup).id.product;
  this->Version = &(this->usetup).id.version;
  *this->BusType = bus_type;
  *this->Vendor = vid;
  *this->Product = pid;
  *this->Version = version;
  set_name(this,name);
  return;
}

Assistant:

uInputDeviceInfo::uInputDeviceInfo(const std::string &name, uint16_t bus_type, uint16_t vid, uint16_t pid, uint16_t version) {
	BusType = bus_type;
	Vendor = vid;
	Product = pid;
	Version = version;
	set_name(name);
}